

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::item::assign
          (item *this,entry *v,span<const_char> salt,sequence_number seq,public_key *pk,
          secret_key *sk)

{
  iterator out;
  char *pcVar1;
  span<const_char> local_498;
  span<const_char> local_488;
  span<const_char> local_478;
  signature local_464;
  int local_424;
  undefined1 local_420 [4];
  int bsize;
  array<char,_1000UL> buffer;
  public_key *pk_local;
  entry *v_local;
  item *this_local;
  sequence_number seq_local;
  span<const_char> salt_local;
  
  seq_local.value = (int64_t)salt.m_ptr;
  buffer._M_elems._992_8_ = pk;
  out = ::std::array<char,_1000UL>::begin((array<char,_1000UL> *)local_420);
  local_424 = bencode<char*>(out,v);
  span<char_const>::span<char,1000ul>
            ((span<char_const> *)&local_488,(array<char,_1000UL> *)local_420);
  local_478 = span<const_char>::first(&local_488,(long)local_424);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_498,(span<const_char> *)&seq_local);
  sign_mutable_item(&local_464,local_478,local_498,seq,(public_key *)buffer._M_elems._992_8_,sk);
  memcpy(&this->m_sig,&local_464,0x40);
  pcVar1 = span<const_char>::data((span<const_char> *)&seq_local);
  span<const_char>::size((span<const_char> *)&seq_local);
  ::std::__cxx11::string::assign((char *)&this->m_salt,(ulong)pcVar1);
  *(undefined8 *)(this->m_pk).bytes._M_elems = *(undefined8 *)buffer._M_elems._992_8_;
  *(undefined8 *)((this->m_pk).bytes._M_elems + 8) = *(undefined8 *)(buffer._M_elems._992_8_ + 8);
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x10) =
       *(undefined8 *)(buffer._M_elems._992_8_ + 0x10);
  *(undefined8 *)((this->m_pk).bytes._M_elems + 0x18) =
       *(undefined8 *)(buffer._M_elems._992_8_ + 0x18);
  sequence_number::operator=(&this->m_seq,seq);
  this->m_mutable = true;
  entry::operator=(&this->m_value,v);
  return;
}

Assistant:

void item::assign(entry v, span<char const> salt
	, sequence_number const seq, public_key const& pk, secret_key const& sk)
{
	std::array<char, 1000> buffer;
	int const bsize = bencode(buffer.begin(), v);
	TORRENT_ASSERT(bsize <= 1000);
	m_sig = sign_mutable_item(span<char const>(buffer).first(bsize)
		, salt, seq, pk, sk);
	m_salt.assign(salt.data(), static_cast<std::size_t>(salt.size()));
	m_pk = pk;
	m_seq = seq;
	m_mutable = true;
	m_value = std::move(v);
}